

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O2

int kex_agree_mac(LIBSSH2_SESSION *session,libssh2_endpoint_data *endpoint,uchar *mac,
                 unsigned_long mac_len)

{
  LIBSSH2_MAC_METHOD **methodlist;
  char *pcVar1;
  uchar *puVar2;
  uchar *puVar3;
  LIBSSH2_MAC_METHOD *pLVar4;
  size_t sVar5;
  int iVar6;
  
  methodlist = _libssh2_mac_methods();
  puVar3 = (uchar *)session->kex_prefs;
  if (puVar3 == (uchar *)0x0) {
    do {
      pLVar4 = *methodlist;
      if (pLVar4 == (LIBSSH2_MAC_METHOD *)0x0) {
        return -1;
      }
      puVar3 = (uchar *)pLVar4->name;
      if (puVar3 == (uchar *)0x0) {
        return -1;
      }
      sVar5 = strlen((char *)puVar3);
      puVar3 = kex_agree_instr((uchar *)endpoint,(unsigned_long)mac,puVar3,sVar5);
      methodlist = methodlist + 1;
    } while (puVar3 == (uchar *)0x0);
LAB_0011f28d:
    session->ssh_msg_debug =
         (_func_void_LIBSSH2_SESSION_ptr_int_char_ptr_int_char_ptr_int_void_ptr_ptr *)pLVar4;
    iVar6 = 0;
  }
  else {
    while ((puVar3 != (uchar *)0x0 && (*puVar3 != '\0'))) {
      pcVar1 = strchr((char *)puVar3,0x2c);
      if (pcVar1 == (char *)0x0) {
        sVar5 = strlen((char *)puVar3);
      }
      else {
        sVar5 = (long)pcVar1 - (long)puVar3;
      }
      puVar2 = kex_agree_instr((uchar *)endpoint,(unsigned_long)mac,puVar3,sVar5);
      if (puVar2 != (uchar *)0x0) {
        pLVar4 = (LIBSSH2_MAC_METHOD *)
                 kex_get_method_by_name((char *)puVar3,sVar5,(LIBSSH2_COMMON_METHOD **)methodlist);
        if (pLVar4 == (LIBSSH2_MAC_METHOD *)0x0) {
          return -1;
        }
        goto LAB_0011f28d;
      }
      puVar3 = (uchar *)(pcVar1 + 1);
      if (pcVar1 == (char *)0x0) {
        puVar3 = (uchar *)0x0;
      }
    }
    iVar6 = -1;
  }
  return iVar6;
}

Assistant:

static int kex_agree_mac(LIBSSH2_SESSION * session,
                         libssh2_endpoint_data * endpoint, unsigned char *mac,
                         unsigned long mac_len)
{
    const LIBSSH2_MAC_METHOD **macp = _libssh2_mac_methods();
    unsigned char *s;
    (void) session;

    if (endpoint->mac_prefs) {
        s = (unsigned char *) endpoint->mac_prefs;

        while (s && *s) {
            unsigned char *p = (unsigned char *) strchr((char *) s, ',');
            size_t method_len = (p ? (size_t)(p - s) : strlen((char *) s));

            if (kex_agree_instr(mac, mac_len, s, method_len)) {
                const LIBSSH2_MAC_METHOD *method = (const LIBSSH2_MAC_METHOD *)
                    kex_get_method_by_name((char *) s, method_len,
                                           (const LIBSSH2_COMMON_METHOD **)
                                           macp);

                if (!method) {
                    /* Invalid method -- Should never be reached */
                    return -1;
                }

                endpoint->mac = method;
                return 0;
            }

            s = p ? p + 1 : NULL;
        }
        return -1;
    }

    while (*macp && (*macp)->name) {
        s = kex_agree_instr(mac, mac_len, (unsigned char *) (*macp)->name,
                            strlen((*macp)->name));
        if (s) {
            endpoint->mac = *macp;
            return 0;
        }
        macp++;
    }

    return -1;
}